

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O1

bool tcu::isLinearSampleResultValid
               (ConstPixelBufferAccess *level,Sampler *sampler,LookupPrecision *prec,Vec2 *coord,
               int coordZ,Vec4 *result)

{
  int size;
  int size_00;
  bool bVar1;
  int iVar2;
  TextureChannelClass TVar3;
  int c;
  int c_00;
  int iVar4;
  int x1;
  int y0;
  int y1;
  int c_01;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  bool local_13d;
  float local_13c;
  Vec2 local_108;
  Vec2 local_100;
  Vec2 vBounds;
  Vec2 uBounds;
  ColorQuad quad;
  
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&uBounds,sampler->normalizedCoords,(level->m_size).m_data[0],
             coord->m_data[0],(prec->coordBits).m_data[0],(prec->uvwBits).m_data[0]);
  TexVerifierUtil::computeNonNormalizedCoordBounds
            ((TexVerifierUtil *)&vBounds,sampler->normalizedCoords,(level->m_size).m_data[1],
             coord->m_data[1],(prec->coordBits).m_data[1],(prec->uvwBits).m_data[1]);
  fVar5 = floorf(uBounds.m_data[0] + -0.5);
  fVar6 = floorf(uBounds.m_data[1] + -0.5);
  fVar7 = floorf(vBounds.m_data[0] + -0.5);
  c_01 = (int)fVar7;
  fVar7 = floorf(vBounds.m_data[1] + -0.5);
  iVar2 = (int)fVar7;
  size = (level->m_size).m_data[0];
  size_00 = (level->m_size).m_data[1];
  TVar3 = getTextureChannelClass((level->m_format).type);
  if (TVar3 == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT) {
    local_13c = computeBilinearSearchStepForSnorm(prec);
  }
  else {
    local_13c = 0.0;
    if (TVar3 == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT) {
      local_13c = computeBilinearSearchStepForUnorm(prec);
    }
  }
  local_13d = c_01 <= iVar2;
  if (c_01 <= iVar2) {
    do {
      c = c_01 + 1;
      iVar4 = (int)fVar5;
      do {
        c_00 = iVar4;
        if ((int)fVar6 < c_00) break;
        iVar4 = TexVerifierUtil::wrap(sampler->wrapS,c_00,size);
        x1 = TexVerifierUtil::wrap(sampler->wrapS,c_00 + 1,size);
        y0 = TexVerifierUtil::wrap(sampler->wrapT,c_01,size_00);
        y1 = TexVerifierUtil::wrap(sampler->wrapT,c,size_00);
        fVar7 = uBounds.m_data[0] + -0.5;
        fVar8 = uBounds.m_data[1] + -0.5;
        fVar9 = vBounds.m_data[0] + -0.5;
        fVar10 = vBounds.m_data[1] + -0.5;
        quad.p11.m_data[0] = 0.0;
        quad.p11.m_data[1] = 0.0;
        quad.p11.m_data[2] = 0.0;
        quad.p11.m_data[3] = 0.0;
        quad.p10.m_data[0] = 0.0;
        quad.p10.m_data[1] = 0.0;
        quad.p10.m_data[2] = 0.0;
        quad.p10.m_data[3] = 0.0;
        quad.p01.m_data[0] = 0.0;
        quad.p01.m_data[1] = 0.0;
        quad.p01.m_data[2] = 0.0;
        quad.p01.m_data[3] = 0.0;
        quad.p00.m_data[0] = 0.0;
        quad.p00.m_data[1] = 0.0;
        quad.p00.m_data[2] = 0.0;
        quad.p00.m_data[3] = 0.0;
        lookupQuad(&quad,level,sampler,iVar4,x1,y0,y1,coordZ);
        if (TVar3 == TEXTURECHANNELCLASS_FLOATING_POINT) {
          local_13c = computeBilinearSearchStepFromFloatQuad(prec,&quad);
        }
        fVar7 = fVar7 - (float)c_00;
        local_100.m_data[0] = 1.0;
        if (fVar7 <= 1.0) {
          local_100.m_data[0] = fVar7;
        }
        local_100.m_data[0] = (float)(~-(uint)(fVar7 < 0.0) & (uint)local_100.m_data[0]);
        fVar8 = fVar8 - (float)c_00;
        local_100.m_data[1] = 1.0;
        if (fVar8 <= 1.0) {
          local_100.m_data[1] = fVar8;
        }
        local_100.m_data[1] = (float)(~-(uint)(fVar8 < 0.0) & (uint)local_100.m_data[1]);
        fVar9 = fVar9 - (float)c_01;
        local_108.m_data[0] = 1.0;
        if (fVar9 <= 1.0) {
          local_108.m_data[0] = fVar9;
        }
        local_108.m_data[0] = (float)(~-(uint)(fVar9 < 0.0) & (uint)local_108.m_data[0]);
        fVar10 = fVar10 - (float)c_01;
        local_108.m_data[1] = 1.0;
        if (fVar10 <= 1.0) {
          local_108.m_data[1] = fVar10;
        }
        local_108.m_data[1] = (float)(~-(uint)(fVar10 < 0.0) & (uint)local_108.m_data[1]);
        bVar1 = isBilinearRangeValid(prec,&quad,&local_100,&local_108,local_13c,result);
        iVar4 = c_00 + 1;
      } while (!bVar1);
    } while (((int)fVar6 < c_00) && (local_13d = c <= iVar2, c_01 = c, c <= iVar2));
  }
  return local_13d;
}

Assistant:

bool isLinearSampleResultValid (const ConstPixelBufferAccess&		level,
								const Sampler&						sampler,
								const LookupPrecision&				prec,
								const Vec2&							coord,
								const int							coordZ,
								const Vec4&							result)
{
	const Vec2					uBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getWidth(),	coord.x(), prec.coordBits.x(), prec.uvwBits.x());
	const Vec2					vBounds			= computeNonNormalizedCoordBounds(sampler.normalizedCoords, level.getHeight(),	coord.y(), prec.coordBits.y(), prec.uvwBits.y());

	// Integer coordinate bounds for (x0,y0) - without wrap mode
	const int					minI			= deFloorFloatToInt32(uBounds.x()-0.5f);
	const int					maxI			= deFloorFloatToInt32(uBounds.y()-0.5f);
	const int					minJ			= deFloorFloatToInt32(vBounds.x()-0.5f);
	const int					maxJ			= deFloorFloatToInt32(vBounds.y()-0.5f);

	const int					w				= level.getWidth();
	const int					h				= level.getHeight();

	const TextureChannelClass	texClass		= getTextureChannelClass(level.getFormat().type);
	float						searchStep		= texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	? computeBilinearSearchStepForUnorm(prec) :
												  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	? computeBilinearSearchStepForSnorm(prec) :
												  0.0f; // Step is computed for floating-point quads based on texel values.

	DE_ASSERT(texClass == TEXTURECHANNELCLASS_UNSIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_SIGNED_FIXED_POINT	||
			  texClass == TEXTURECHANNELCLASS_FLOATING_POINT);

	// \todo [2013-07-03 pyry] This could be optimized by first computing ranges based on wrap mode.

	for (int j = minJ; j <= maxJ; j++)
	{
		for (int i = minI; i <= maxI; i++)
		{
			// Wrapped coordinates
			const int	x0		= wrap(sampler.wrapS, i  , w);
			const int	x1		= wrap(sampler.wrapS, i+1, w);
			const int	y0		= wrap(sampler.wrapT, j  , h);
			const int	y1		= wrap(sampler.wrapT, j+1, h);

			// Bounds for filtering factors
			const float	minA	= de::clamp((uBounds.x()-0.5f)-float(i), 0.0f, 1.0f);
			const float	maxA	= de::clamp((uBounds.y()-0.5f)-float(i), 0.0f, 1.0f);
			const float	minB	= de::clamp((vBounds.x()-0.5f)-float(j), 0.0f, 1.0f);
			const float	maxB	= de::clamp((vBounds.y()-0.5f)-float(j), 0.0f, 1.0f);

			ColorQuad quad;
			lookupQuad(quad, level, sampler, x0, x1, y0, y1, coordZ);

			if (texClass == TEXTURECHANNELCLASS_FLOATING_POINT)
				searchStep = computeBilinearSearchStepFromFloatQuad(prec, quad);

			if (isBilinearRangeValid(prec, quad, Vec2(minA, maxA), Vec2(minB, maxB), searchStep, result))
				return true;
		}
	}

	return false;
}